

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O3

unique_ptr<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>_>
__thiscall
cppcms::impl::cgi::fastcgi_api_tcp_socket_factory
          (cgi *this,service *srv,string *ip,int port,int backlog)

{
  pointer pcVar1;
  socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
  *this_00;
  string local_50;
  
  this_00 = (socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
             *)operator_new(0x68);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (ip->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + ip->_M_string_length);
  socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
  ::socket_acceptor(this_00,srv,&local_50,port,backlog);
  *(socket_acceptor<cppcms::impl::cgi::fastcgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::fastcgi>_>
    **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>,_true,_true>
          )(__uniq_ptr_data<cppcms::impl::cgi::acceptor,_std::default_delete<cppcms::impl::cgi::acceptor>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<acceptor> fastcgi_api_tcp_socket_factory(cppcms::service &srv,std::string ip,int port,int backlog)
	{
		std::unique_ptr<acceptor> a(new socket_acceptor<fastcgi>(srv,ip,port,backlog));
		return a;
	}